

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O1

bool __thiscall btBox2dShape::isInside(btBox2dShape *this,btVector3 *pt,btScalar tolerance)

{
  float fVar1;
  
  fVar1 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  if ((pt->m_floats[0] <= fVar1 + tolerance) && (-fVar1 - tolerance <= pt->m_floats[0])) {
    fVar1 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
            m_implicitShapeDimensions.m_floats[1];
    if ((pt->m_floats[1] <= fVar1 + tolerance) && (-fVar1 - tolerance <= pt->m_floats[1])) {
      fVar1 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
              m_implicitShapeDimensions.m_floats[2];
      if (pt->m_floats[2] <= fVar1 + tolerance) {
        return -fVar1 - tolerance <= pt->m_floats[2];
      }
    }
  }
  return false;
}

Assistant:

virtual	bool isInside(const btVector3& pt,btScalar tolerance) const
	{
		btVector3 halfExtents = getHalfExtentsWithoutMargin();

		//btScalar minDist = 2*tolerance;
		
		bool result =	(pt.x() <= (halfExtents.x()+tolerance)) &&
						(pt.x() >= (-halfExtents.x()-tolerance)) &&
						(pt.y() <= (halfExtents.y()+tolerance)) &&
						(pt.y() >= (-halfExtents.y()-tolerance)) &&
						(pt.z() <= (halfExtents.z()+tolerance)) &&
						(pt.z() >= (-halfExtents.z()-tolerance));
		
		return result;
	}